

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

RequestBuilder * __thiscall
restincurl::RequestBuilder::SendData<std::__cxx11::string>
          (RequestBuilder *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Head_base<0UL,_restincurl::Request_*,_false> _Var3;
  __uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
  _Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  unique_ptr<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_> dh;
  RequestBuilder *pRVar8;
  
  if (this->is_built_ != true) {
    dh._M_t.
    super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
    .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>,_true,_true>
          )operator_new(0x30);
    *(undefined ***)
     dh._M_t.
     super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
     ._M_t.
     super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
     .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl =
         &PTR__OutDataHandler_0013b938;
    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
    ((long)dh._M_t.
           super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
           .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl + 8))->
    _M_dataplus = (_Alloc_hider)
                  ((long)dh._M_t.
                         super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
                         .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl +
                  0x18U);
    pcVar2 = (data->_M_dataplus)._M_p;
    paVar1 = &data->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar5 = *(undefined4 *)((long)&data->field_2 + 4);
      uVar6 = *(undefined4 *)((long)&data->field_2 + 8);
      uVar7 = *(undefined4 *)((long)&data->field_2 + 0xc);
      *(undefined4 *)
       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((long)dh._M_t.
               super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
               .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl + 0x18U))->
        _M_dataplus = *(undefined4 *)paVar1;
      *(undefined4 *)
       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((long)dh._M_t.
               super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
               .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl + 0x1c))->
        _M_dataplus = uVar5;
      *(undefined4 *)
       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((long)dh._M_t.
               super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
               .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl + 0x20))->
        _M_dataplus = uVar6;
      *(undefined4 *)
       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((long)dh._M_t.
               super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
               .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl + 0x24))->
        _M_dataplus = uVar7;
    }
    else {
      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      ((long)dh._M_t.
             super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
             .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl + 8))->
      _M_dataplus = (_Alloc_hider)pcVar2;
      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      ((long)dh._M_t.
             super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
             .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl + 0x18))->
      _M_dataplus = (_Alloc_hider)paVar1->_M_allocated_capacity;
    }
    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
    ((long)dh._M_t.
           super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
           .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl + 0x10))->
    _M_dataplus = (_Alloc_hider)data->_M_string_length;
    (data->_M_dataplus)._M_p = (pointer)paVar1;
    data->_M_string_length = 0;
    (data->field_2)._M_local_buf[0] = '\0';
    *(size_t *)
     ((long)dh._M_t.
            super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
            .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl + 0x28) = 0;
    _Var3._M_head_impl =
         (this->request_)._M_t.
         super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
         super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
         super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
    _Var4._M_t.
    super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
    .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl =
         *(tuple<restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_> *
          )&((_Var3._M_head_impl)->default_out_handler_)._M_t;
    ((_Var3._M_head_impl)->default_out_handler_)._M_t =
         dh._M_t.
         super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
         .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
         )_Var4._M_t.
          super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
          .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
         )0x0) {
      (**(code **)(*(long *)_Var4._M_t.
                            super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
                            .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>.
                            _M_head_impl + 8))();
    }
    pRVar8 = SendData<std::__cxx11::string>
                       (this,(OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)dh._M_t.
                                super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
                                .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>.
                                _M_head_impl);
    return pRVar8;
  }
  __assert_fail("!is_built_",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x5a0,
                "RequestBuilder &restincurl::RequestBuilder::SendData(T) [T = std::basic_string<char>]"
               );
}

Assistant:

RequestBuilder& SendData(T data) {
            assert(!is_built_);
            auto handler = std::make_unique<OutDataHandler<T>>(std::move(data));
            auto& handler_ref = *handler;
            request_->SetDefaultOutHandler(std::move(handler));
            return SendData(handler_ref);
        }